

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

shared_ptr<BreakPoint> __thiscall Debugger::FindBreakPoint(Debugger *this,lua_Debug *ar)

{
  lua_State *plVar1;
  lua_Debug *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<BreakPoint> sVar3;
  bool local_c1;
  undefined1 local_a0 [8];
  string chunkname;
  _Self local_68;
  undefined1 local_60 [8];
  set<int,_std::less<int>,_std::allocator<int>_> lineSet;
  int cl;
  lua_State *L;
  lua_Debug *ar_local;
  Debugger *this_local;
  
  if ((ar->u).ar51.namewhat == (char *)0x0) {
    std::shared_ptr<BreakPoint>::shared_ptr((shared_ptr<BreakPoint> *)this,(nullptr_t)0x0);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    plVar1 = (lua_State *)(ar->u).ar51.namewhat;
    lineSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = getDebugCurrentLine(in_RDX);
    EmmyDebuggerManager::GetLineSet
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60,
               (EmmyDebuggerManager *)(ar->u).ar51.source);
    local_c1 = false;
    if (-1 < lineSet._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
      local_68._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60,
                      (key_type *)
                      ((long)&lineSet._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
      chunkname.field_2._8_8_ =
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
      local_c1 = std::operator!=(&local_68,(_Self *)((long)&chunkname.field_2 + 8));
    }
    if (local_c1 == false) {
      std::shared_ptr<BreakPoint>::shared_ptr((shared_ptr<BreakPoint> *)this,(nullptr_t)0x0);
    }
    else {
      (*lua_getinfo)(plVar1,"S",in_RDX);
      GetFile_abi_cxx11_((string *)local_a0,(Debugger *)ar,in_RDX);
      FindBreakPoint(this,(string *)ar,(int)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BreakPoint>)sVar3.super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BreakPoint> Debugger::FindBreakPoint(lua_Debug *ar) {
	if (!currentL) {
		return nullptr;
	}

	auto L = currentL;

	const int cl = getDebugCurrentLine(ar);
	auto lineSet = manager->GetLineSet();

	if (cl >= 0 && lineSet.find(cl) != lineSet.end()) {
		lua_getinfo(L, "S", ar);
		const auto chunkname = GetFile(ar);
		return FindBreakPoint(chunkname, cl);
	}
	return nullptr;
}